

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,REF_INT *face_nodes)

{
  uint uVar1;
  REF_INT local_d0;
  REF_INT local_cc;
  int local_c8;
  REF_INT local_c4;
  REF_INT local_c0;
  int local_bc;
  REF_INT local_b8;
  REF_INT local_b4;
  int local_b0;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL complete;
  REF_DBL uvw [3];
  double local_58;
  REF_DBL t;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_INT face_node1;
  REF_INT face_node0;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *face_nodes_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->cell[8];
  _face_node1 = ref_grid->node;
  item = *face_nodes;
  cell_node = face_nodes[1];
  if ((item < 0) || ((*(REF_ADJ *)&ref_node->naux)->nnode <= item)) {
    local_b0 = -1;
  }
  else {
    local_b0 = (*(REF_ADJ *)&ref_node->naux)->first[item];
  }
  cell = local_b0;
  if (local_b0 == -1) {
    local_b4 = -1;
  }
  else {
    local_b4 = (*(REF_ADJ *)&ref_node->naux)->item[local_b0].ref;
  }
  node0 = local_b4;
  ref_cell = (REF_CELL)face_nodes;
  face_nodes_local = (REF_INT *)ref_grid;
  do {
    if (cell == -1) {
      item = ref_cell->last_node_is_an_id;
      cell_node = ref_cell->size_per;
      if ((item < 0) || (**(int **)&ref_node->naux <= item)) {
        local_bc = -1;
      }
      else {
        local_bc = *(int *)(*(long *)(*(long *)&ref_node->naux + 8) + (long)item * 4);
      }
      cell = local_bc;
      if (local_bc == -1) {
        local_c0 = -1;
      }
      else {
        local_c0 = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 0x10) + 4 + (long)local_bc * 8)
        ;
      }
      node0 = local_c0;
      while (cell != -1) {
        for (cell_edge = 0; cell_edge < *(int *)&ref_node->field_0xc; cell_edge = cell_edge + 1) {
          if (cell_node ==
              *(int *)((long)ref_node->real + (long)(cell_edge + ref_node->blank * node0) * 4)) {
            for (node1 = 0; node1 < *(int *)&ref_node->global; node1 = node1 + 1) {
              t._4_4_ = *(int *)((long)ref_node->real +
                                (long)(*(int *)((long)ref_node->sorted_global +
                                               (long)(node1 << 1) * 4) + ref_node->blank * node0) *
                                4);
              t._0_4_ = *(int *)((long)ref_node->real +
                                (long)(*(int *)((long)ref_node->sorted_global +
                                               (long)(node1 * 2 + 1) * 4) + ref_node->blank * node0)
                                * 4);
              if ((((t._4_4_ != item) && (t._0_4_ != item)) && (t._4_4_ != cell_node)) &&
                 (t._0_4_ != cell_node)) {
                uVar1 = ref_node_tri_seg_intersection
                                  (_face_node1,t._4_4_,t._0_4_,(REF_INT *)ref_cell,&local_58,
                                   (REF_DBL *)&ref_private_macro_code_rss);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x39e,"ref_layer_recover_face",(ulong)uVar1,"int");
                  return uVar1;
                }
                if (((0.0 < local_58) && (local_58 < 1.0)) &&
                   ((0.0 < _ref_private_macro_code_rss && ((0.0 < uvw[0] && (0.0 < uvw[1])))))) {
                  printf("t %f u %f v %f w %f \n",local_58,_ref_private_macro_code_rss,uvw[0],uvw[1]
                        );
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,ref_cell->type,
                                         &ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a2,"ref_layer_recover_face",(ulong)uVar1,"n0");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,
                                         ref_cell->last_node_is_an_id,&ref_private_macro_code_rss_1)
                  ;
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a5,"ref_layer_recover_face",(ulong)uVar1,"n1");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,
                                         ref_cell->size_per,&ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a8,"ref_layer_recover_face",(ulong)uVar1,"n2");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  printf("nothing \n");
                }
              }
            }
          }
        }
        cell = *(int *)(*(long *)(*(long *)&ref_node->naux + 0x10) + (long)cell * 8);
        if (cell == -1) {
          local_c4 = -1;
        }
        else {
          local_c4 = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 0x10) + 4 + (long)cell * 8);
        }
        node0 = local_c4;
      }
      item = ref_cell->size_per;
      cell_node = ref_cell->type;
      if ((item < 0) || (**(int **)&ref_node->naux <= item)) {
        local_c8 = -1;
      }
      else {
        local_c8 = *(int *)(*(long *)(*(long *)&ref_node->naux + 8) + (long)item * 4);
      }
      cell = local_c8;
      if (local_c8 == -1) {
        local_cc = -1;
      }
      else {
        local_cc = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 0x10) + 4 + (long)local_c8 * 8)
        ;
      }
      node0 = local_cc;
      do {
        if (cell == -1) {
          return 0;
        }
        for (cell_edge = 0; cell_edge < *(int *)&ref_node->field_0xc; cell_edge = cell_edge + 1) {
          if (cell_node ==
              *(int *)((long)ref_node->real + (long)(cell_edge + ref_node->blank * node0) * 4)) {
            for (node1 = 0; node1 < *(int *)&ref_node->global; node1 = node1 + 1) {
              t._4_4_ = *(int *)((long)ref_node->real +
                                (long)(*(int *)((long)ref_node->sorted_global +
                                               (long)(node1 << 1) * 4) + ref_node->blank * node0) *
                                4);
              t._0_4_ = *(int *)((long)ref_node->real +
                                (long)(*(int *)((long)ref_node->sorted_global +
                                               (long)(node1 * 2 + 1) * 4) + ref_node->blank * node0)
                                * 4);
              if ((((t._4_4_ != item) && (t._0_4_ != item)) && (t._4_4_ != cell_node)) &&
                 (t._0_4_ != cell_node)) {
                uVar1 = ref_node_tri_seg_intersection
                                  (_face_node1,t._4_4_,t._0_4_,(REF_INT *)ref_cell,&local_58,
                                   (REF_DBL *)&ref_private_macro_code_rss);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x3ba,"ref_layer_recover_face",(ulong)uVar1,"int");
                  return uVar1;
                }
                if (((0.0 < local_58) && (local_58 < 1.0)) &&
                   ((0.0 < _ref_private_macro_code_rss && ((0.0 < uvw[0] && (0.0 < uvw[1])))))) {
                  printf("t %f u %f v %f w %f \n",local_58,_ref_private_macro_code_rss,uvw[0],uvw[1]
                        );
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,ref_cell->type,
                                         &ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3be,"ref_layer_recover_face",(ulong)uVar1,"n0");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,
                                         ref_cell->last_node_is_an_id,&ref_private_macro_code_rss_1)
                  ;
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3c1,"ref_layer_recover_face",(ulong)uVar1,"n1");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,
                                         ref_cell->size_per,&ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3c4,"ref_layer_recover_face",(ulong)uVar1,"n2");
                    return uVar1;
                  }
                  if (ref_private_macro_code_rss_1 != 0) break;
                  printf("nothing \n");
                }
              }
            }
          }
        }
        cell = *(int *)(*(long *)(*(long *)&ref_node->naux + 0x10) + (long)cell * 8);
        if (cell == -1) {
          local_d0 = -1;
        }
        else {
          local_d0 = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 0x10) + 4 + (long)cell * 8);
        }
        node0 = local_d0;
      } while( true );
    }
    for (cell_edge = 0; cell_edge < *(int *)&ref_node->field_0xc; cell_edge = cell_edge + 1) {
      if (cell_node ==
          *(int *)((long)ref_node->real + (long)(cell_edge + ref_node->blank * node0) * 4)) {
        for (node1 = 0; node1 < *(int *)&ref_node->global; node1 = node1 + 1) {
          t._4_4_ = *(int *)((long)ref_node->real +
                            (long)(*(int *)((long)ref_node->sorted_global + (long)(node1 << 1) * 4)
                                  + ref_node->blank * node0) * 4);
          t._0_4_ = *(int *)((long)ref_node->real +
                            (long)(*(int *)((long)ref_node->sorted_global +
                                           (long)(node1 * 2 + 1) * 4) + ref_node->blank * node0) * 4
                            );
          if ((((t._4_4_ != item) && (t._0_4_ != item)) && (t._4_4_ != cell_node)) &&
             (t._0_4_ != cell_node)) {
            uVar1 = ref_node_tri_seg_intersection
                              (_face_node1,t._4_4_,t._0_4_,(REF_INT *)ref_cell,&local_58,
                               (REF_DBL *)&ref_private_macro_code_rss);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x382,"ref_layer_recover_face",(ulong)uVar1,"int");
              return uVar1;
            }
            if (((0.0 < local_58) && (local_58 < 1.0)) &&
               ((0.0 < _ref_private_macro_code_rss && ((0.0 < uvw[0] && (0.0 < uvw[1])))))) {
              printf("t %f u %f v %f w %f \n",local_58,_ref_private_macro_code_rss,uvw[0],uvw[1]);
              uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,ref_cell->type,
                                     &ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x386,"ref_layer_recover_face",(ulong)uVar1,"n0");
                return uVar1;
              }
              if (ref_private_macro_code_rss_1 != 0) break;
              uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,
                                     ref_cell->last_node_is_an_id,&ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x389,"ref_layer_recover_face",(ulong)uVar1,"n1");
                return uVar1;
              }
              if (ref_private_macro_code_rss_1 != 0) break;
              uVar1 = ref_layer_swap((REF_GRID)face_nodes_local,t._4_4_,t._0_4_,ref_cell->size_per,
                                     &ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x38c,"ref_layer_recover_face",(ulong)uVar1,"n2");
                return uVar1;
              }
              if (ref_private_macro_code_rss_1 != 0) break;
              printf("nothing \n");
            }
          }
        }
      }
    }
    cell = *(int *)(*(long *)(*(long *)&ref_node->naux + 0x10) + (long)cell * 8);
    if (cell == -1) {
      local_b8 = -1;
    }
    else {
      local_b8 = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 0x10) + 4 + (long)cell * 8);
    }
    node0 = local_b8;
  } while( true );
}

Assistant:

static REF_FCN REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,
                                                 REF_INT *face_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node0, face_node1, item, cell_node, cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL t, uvw[3];
  REF_BOOL complete;
  face_node0 = face_nodes[0];
  face_node1 = face_nodes[1];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[1];
  face_node1 = face_nodes[2];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[2];
  face_node1 = face_nodes[0];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  return REF_SUCCESS;
}